

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void draw_chesses(char *chesses)

{
  int value;
  int index;
  int col;
  int row;
  char *chesses_local;
  
  for (index = 1; index < 0x10; index = index + 1) {
    for (value = 1; value < 0x10; value = value + 1) {
      if (chesses[(index + -1) * 0xf + value + -1] == 0) {
        printf(anon_var_dwarf_2b);
      }
      else if ((int)chesses[(index + -1) * 0xf + value + -1] % 2 == 0) {
        printf(anon_var_dwarf_4e);
      }
      else {
        printf(anon_var_dwarf_58);
      }
    }
    printf(anon_var_dwarf_22a + 0x15);
  }
  return;
}

Assistant:

void draw_chesses(char chesses[]) {
    for (int row = 1; row <= 15; row++) {
        for (int col = 1; col <= 15; col++) {
            int index = (row - 1) * 15 + (col - 1);
            int value = chesses[index];
            if (value == 0) {
                printf(CHESS_BOARD);
            }
            else if (value % 2 == 0) {
                printf(BLACK_CHESS);
            } 
            else {
                printf(WHITE_CHESS);
            }
        }
        printf("\n");
    }
}